

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping.c
# Opt level: O2

int mpt_mapping_cmp(mpt_mapping *map,mpt_valsrc *src,int cli)

{
  int iVar1;
  
  if ((cli < 0) || ((uint)map->client == cli)) {
    if ((map->src).dim == src->dim) {
      return (int)(((map->src).state & src->state) == 0);
    }
    iVar1 = -2;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int mpt_mapping_cmp(const MPT_STRUCT(mapping) *map, const MPT_STRUCT(valsrc) *src, int cli)
{
	if (cli >= 0 && (map->client != cli)) {
		return -1;
	}
	if (map->src.dim != src->dim) {
		return -2;
	}
	if (map->src.state & src->state) {
		return 0;
	}
	return 1;
}